

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O2

Json * Json::parseFile(Json *__return_storage_ptr__,string *path_to_file)

{
  char cVar1;
  string data;
  path path;
  ifstream f;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>(&path,path_to_file);
  std::ifstream::ifstream(&f,path._M_pathname._M_dataplus._M_p,_S_in);
  cVar1 = std::experimental::filesystem::v1::file_size(&path);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  std::__cxx11::string::_M_construct((ulong)&data,cVar1);
  std::istream::read((char *)&f,(long)data._M_dataplus._M_p);
  Json(__return_storage_ptr__,&data);
  std::__cxx11::string::~string((string *)&data);
  std::ifstream::~ifstream(&f);
  std::experimental::filesystem::v1::__cxx11::path::~path(&path);
  return __return_storage_ptr__;
}

Assistant:

Json Json::parseFile(const std::string& path_to_file) {
    std::experimental::filesystem::path path(path_to_file);
    std::ifstream f(path);
    const auto size = std::experimental::filesystem::file_size(path);
    std::string data(size, ' ');
    f.read(data.data(), size);
    return Json(data);
}